

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O1

void __thiscall
glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test::initInternals
          (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6d0))(1,&this->fbo_id);
  (**(code **)(lVar3 + 0x78))(0x8d40,this->fbo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not set up a framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x6a6);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id);
  (**(code **)(lVar3 + 0xb8))(0x9102,this->to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not set up a texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x6ac);
  return;
}

Assistant:

void MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate and bind a framebuffer object */
	gl.genFramebuffers(1, &fbo_id);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a framebuffer object");

	/* Generate and bind a texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target */
	gl.genTextures(1, &to_id);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a texture object");
}